

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::AddCustomCommandToCreateObject
          (cmLocalGenerator *this,char *ofname,string *lang,cmSourceFile *source,
          cmGeneratorTarget *target)

{
  cmOutputConverter *this_00;
  pointer *ppbVar1;
  char **ppcVar2;
  cmMakefile *this_01;
  _Alloc_hider comment_00;
  string *psVar3;
  char *pcVar4;
  size_t sVar5;
  char *command;
  pointer s;
  string comment;
  allocator local_291;
  string *local_290;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string varString;
  string flags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  cmCustomCommandLines commandLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rules;
  string objectDir;
  string local_168;
  string sourceFile;
  string objectFile;
  RuleVariables vars;
  
  local_290 = lang;
  std::__cxx11::string::string((string *)&vars,ofname,(allocator *)&objectFile);
  cmsys::SystemTools::GetFilenamePath(&objectDir,(string *)&vars);
  ppcVar2 = &vars.TargetCompilePDB;
  if (vars.CMTarget != (cmTarget *)ppcVar2) {
    operator_delete(vars.CMTarget,(ulong)(vars.TargetCompilePDB + 1));
  }
  this_00 = &this->super_cmOutputConverter;
  cmOutputConverter::Convert((string *)&vars,this_00,&objectDir,START_OUTPUT,SHELL);
  std::__cxx11::string::operator=((string *)&objectDir,(string *)&vars);
  if (vars.CMTarget != (cmTarget *)ppcVar2) {
    operator_delete(vars.CMTarget,(ulong)(vars.TargetCompilePDB + 1));
  }
  std::__cxx11::string::string((string *)&vars,ofname,(allocator *)&sourceFile);
  cmOutputConverter::Convert(&objectFile,this_00,(string *)&vars,START_OUTPUT,SHELL);
  if (vars.CMTarget != (cmTarget *)ppcVar2) {
    operator_delete(vars.CMTarget,(ulong)(vars.TargetCompilePDB + 1));
  }
  psVar3 = cmSourceFile::GetFullPath(source,(string *)0x0);
  cmOutputConverter::ConvertToOutputFormat(&sourceFile,this_00,psVar3,SHELL);
  varString._M_dataplus._M_p = (pointer)&varString.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&varString,"CMAKE_","");
  std::__cxx11::string::_M_append((char *)&varString,(ulong)(local_290->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)&varString);
  rules.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  rules.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  rules.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar4 = cmMakefile::GetRequiredDefinition(this->Makefile,&varString);
  std::__cxx11::string::string((string *)&vars,pcVar4,(allocator *)&flags);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&rules,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars);
  if (vars.CMTarget != (cmTarget *)ppcVar2) {
    operator_delete(vars.CMTarget,(ulong)(vars.TargetCompilePDB + 1));
  }
  std::__cxx11::string::_M_replace((ulong)&varString,0,(char *)varString._M_string_length,0x4ab102);
  std::__cxx11::string::_M_append((char *)&varString,(ulong)(local_290->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)&varString);
  flags._M_dataplus._M_p = (pointer)&flags.field_2;
  flags._M_string_length = 0;
  flags.field_2._M_local_buf[0] = '\0';
  cmMakefile::GetSafeDefinition(this->Makefile,&varString);
  std::__cxx11::string::append((char *)&flags);
  std::__cxx11::string::append((char *)&flags);
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vars.CMTarget = (cmTarget *)ppcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&vars,"");
  GetIncludeDirectories(this,&includes,target,local_290,(string *)&vars,true);
  if (vars.CMTarget != (cmTarget *)ppcVar2) {
    operator_delete(vars.CMTarget,(ulong)(vars.TargetCompilePDB + 1));
  }
  comment._M_dataplus._M_p = (pointer)&comment.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&comment,"");
  GetIncludeFlags((string *)&vars,this,&includes,target,local_290,false,false,&comment);
  std::__cxx11::string::_M_append((char *)&flags,(ulong)vars.CMTarget);
  if (vars.CMTarget != (cmTarget *)ppcVar2) {
    operator_delete(vars.CMTarget,(ulong)(vars.TargetCompilePDB + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment._M_dataplus._M_p != &comment.field_2) {
    operator_delete(comment._M_dataplus._M_p,comment.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&includes);
  std::__cxx11::string::append((char *)&flags);
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmSystemTools::ExpandList(&rules,&commands);
  memset(&vars,0,0xd8);
  vars.Language = (local_290->_M_dataplus)._M_p;
  vars.Source = sourceFile._M_dataplus._M_p;
  vars.Object = objectFile._M_dataplus._M_p;
  vars.ObjectDir = objectDir._M_dataplus._M_p;
  vars.Flags = flags._M_dataplus._M_p;
  if (commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    s = commands.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
    do {
      ExpandRuleVariables(this,s,&vars);
      comment._M_dataplus._M_p = (pointer)0x0;
      comment._M_string_length = 0;
      comment.field_2._M_allocated_capacity = 0;
      cmSystemTools::ParseArguments_abi_cxx11_
                (&includes,(cmSystemTools *)(s->_M_dataplus)._M_p,command);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&comment,
                 comment._M_string_length,
                 includes.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 includes.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                (&commandLines.
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                 (value_type *)&comment);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&includes);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&comment);
      s = s + 1;
    } while (s != commands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
  }
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  comment._M_dataplus._M_p = (pointer)&comment.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&comment,"OBJECT_DEPENDS","");
  pcVar4 = cmSourceFile::GetProperty(source,&comment);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment._M_dataplus._M_p != &comment.field_2) {
    operator_delete(comment._M_dataplus._M_p,comment.field_2._M_allocated_capacity + 1);
  }
  if (pcVar4 != (char *)0x0) {
    comment._M_dataplus._M_p = (pointer)&comment.field_2;
    sVar5 = strlen(pcVar4);
    std::__cxx11::string::_M_construct<char_const*>((string *)&comment,pcVar4,pcVar4 + sVar5);
    cmSystemTools::ExpandListArgument(&comment,&depends,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)comment._M_dataplus._M_p != &comment.field_2) {
      operator_delete(comment._M_dataplus._M_p,comment.field_2._M_allocated_capacity + 1);
    }
  }
  comment._M_dataplus._M_p = (pointer)&comment.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&comment,"Building ","");
  std::__cxx11::string::_M_append((char *)&comment,(ulong)(local_290->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)&comment);
  std::__cxx11::string::string((string *)&local_168,ofname,&local_291);
  cmOutputConverter::Convert((string *)&includes,this_00,&local_168,START_OUTPUT,UNCHANGED);
  std::__cxx11::string::_M_append
            ((char *)&comment,
             (ulong)includes.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  ppbVar1 = &includes.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (includes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
    operator_delete(includes.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((includes.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  this_01 = this->Makefile;
  std::__cxx11::string::string((string *)&includes,ofname,(allocator *)&local_168);
  psVar3 = cmSourceFile::GetFullPath(source,(string *)0x0);
  comment_00 = comment._M_dataplus;
  pcVar4 = cmState::Snapshot::GetCurrentBinaryDirectory(&this->StateSnapshot);
  cmMakefile::AddCustomCommandToOutput
            (this_01,(string *)&includes,&depends,psVar3,&commandLines,comment_00._M_p,pcVar4,false,
             true,false);
  if (includes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
    operator_delete(includes.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((includes.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment._M_dataplus._M_p != &comment.field_2) {
    operator_delete(comment._M_dataplus._M_p,comment.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
            (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)flags._M_dataplus._M_p != &flags.field_2) {
    operator_delete(flags._M_dataplus._M_p,
                    CONCAT71(flags.field_2._M_allocated_capacity._1_7_,flags.field_2._M_local_buf[0]
                            ) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&rules);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)varString._M_dataplus._M_p != &varString.field_2) {
    operator_delete(varString._M_dataplus._M_p,varString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sourceFile._M_dataplus._M_p != &sourceFile.field_2) {
    operator_delete(sourceFile._M_dataplus._M_p,sourceFile.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objectFile._M_dataplus._M_p != &objectFile.field_2) {
    operator_delete(objectFile._M_dataplus._M_p,objectFile.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objectDir._M_dataplus._M_p != &objectDir.field_2) {
    operator_delete(objectDir._M_dataplus._M_p,objectDir.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::AddCustomCommandToCreateObject(const char* ofname,
                                                    const std::string& lang,
                                                    cmSourceFile& source,
                                                    cmGeneratorTarget& target)
{
  std::string objectDir = cmSystemTools::GetFilenamePath(std::string(ofname));
  objectDir = this->Convert(objectDir,START_OUTPUT,SHELL);
  std::string objectFile = this->Convert(ofname,START_OUTPUT,SHELL);
  std::string sourceFile =
      this->ConvertToOutputFormat(source.GetFullPath(), SHELL);
  std::string varString = "CMAKE_";
  varString += lang;
  varString += "_COMPILE_OBJECT";
  std::vector<std::string> rules;
  rules.push_back(this->Makefile->GetRequiredDefinition(varString));
  varString = "CMAKE_";
  varString += lang;
  varString += "_FLAGS";
  std::string flags;
  flags += this->Makefile->GetSafeDefinition(varString);
  flags += " ";
    {
    std::vector<std::string> includes;
    this->GetIncludeDirectories(includes, &target, lang);
    flags += this->GetIncludeFlags(includes, &target, lang);
    }
  flags += this->Makefile->GetDefineFlags();

  // Construct the command lines.
  cmCustomCommandLines commandLines;
  std::vector<std::string> commands;
  cmSystemTools::ExpandList(rules, commands);
  cmLocalGenerator::RuleVariables vars;
  vars.Language = lang.c_str();
  vars.Source = sourceFile.c_str();
  vars.Object = objectFile.c_str();
  vars.ObjectDir = objectDir.c_str();
  vars.Flags = flags.c_str();
  for(std::vector<std::string>::iterator i = commands.begin();
      i != commands.end(); ++i)
    {
    // Expand the full command line string.
    this->ExpandRuleVariables(*i, vars);

    // Parse the string to get the custom command line.
    cmCustomCommandLine commandLine;
    std::vector<std::string> cmd = cmSystemTools::ParseArguments(i->c_str());
    commandLine.insert(commandLine.end(), cmd.begin(), cmd.end());

    // Store this command line.
    commandLines.push_back(commandLine);
    }

  // Check for extra object-file dependencies.
  std::vector<std::string> depends;
  const char* additionalDeps = source.GetProperty("OBJECT_DEPENDS");
  if(additionalDeps)
    {
    cmSystemTools::ExpandListArgument(additionalDeps, depends);
    }

  // Generate a meaningful comment for the command.
  std::string comment = "Building ";
  comment += lang;
  comment += " object ";
  comment += this->Convert(ofname, START_OUTPUT);

  // Add the custom command to build the object file.
  this->Makefile->AddCustomCommandToOutput(
    ofname,
    depends,
    source.GetFullPath(),
    commandLines,
    comment.c_str(),
    this->StateSnapshot.GetCurrentBinaryDirectory()
    );
}